

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

void __thiscall
TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_TestShell::
~TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_TestShell
          (TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(3, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 40).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 40).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(5, 0).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(5, 0).second);

	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(6, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(6, 0).second);
	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(7, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(7, 0).second);

	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(8, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(8, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(9, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(9, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(10, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(10, 0).second);

	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(11, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(11, 0).second);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(12, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(12, 0).second);

	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(13, 0).first);
	CHECK_EQUAL(16000, t.nonDealerSelfDrawn(13, 0).second);
}